

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitMethodFld(bool isRoot,bool isScoped,RegSlot location,RegSlot callObjLocation,
                  PropertyId propertyId,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                  bool registerCacheIdForCall)

{
  uint uVar1;
  OpCode op;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,isRoot) == 0) {
    op = LdMethodFld;
    if (funcInfo->frameObjRegister == callObjLocation) {
      op = LdLocalMethodFld;
    }
  }
  else {
    op = ScopedLdMethodFld;
    if (!isScoped) {
      uVar1 = FuncInfo::FindOrAddRootObjectInlineCacheId(funcInfo,propertyId,true,false);
      Js::ByteCodeWriter::PatchableRootProperty
                (&byteCodeGenerator->m_writer,LdRootMethodFld,location,uVar1,true,false,
                 registerCacheIdForCall);
      return;
    }
  }
  uVar1 = FuncInfo::FindOrAddInlineCacheId(funcInfo,callObjLocation,propertyId,true,false);
  if (funcInfo->frameObjRegister != callObjLocation) {
    Js::ByteCodeWriter::PatchableProperty
              (&byteCodeGenerator->m_writer,op,location,callObjLocation,uVar1,false,
               registerCacheIdForCall);
    return;
  }
  Js::ByteCodeWriter::ElementP
            (&byteCodeGenerator->m_writer,op,location,uVar1,false,registerCacheIdForCall);
  return;
}

Assistant:

void EmitMethodFld(bool isRoot, bool isScoped, Js::RegSlot location, Js::RegSlot callObjLocation, Js::PropertyId propertyId, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, bool registerCacheIdForCall = true)
{
    Js::OpCode opcode;
    if (!isRoot)
    {
        if (callObjLocation == funcInfo->frameObjRegister)
        {
            opcode = Js::OpCode::LdLocalMethodFld;
        }
        else
        {
            opcode = Js::OpCode::LdMethodFld;
        }
    }
    else if (isScoped)
    {
        opcode = Js::OpCode::ScopedLdMethodFld;
    }
    else
    {
        opcode = Js::OpCode::LdRootMethodFld;
    }

    if (isScoped || !isRoot)
    {
        Assert(isScoped || !isRoot || callObjLocation == ByteCodeGenerator::RootObjectRegister);
        uint cacheId = funcInfo->FindOrAddInlineCacheId(callObjLocation, propertyId, true, false);
        if (callObjLocation == funcInfo->frameObjRegister)
        {
            byteCodeGenerator->Writer()->ElementP(opcode, location, cacheId, false /*isCtor*/, registerCacheIdForCall);
        }
        else
        {
            byteCodeGenerator->Writer()->PatchableProperty(opcode, location, callObjLocation, cacheId, false /*isCtor*/, registerCacheIdForCall);
        }
    }
    else
    {
        uint cacheId = funcInfo->FindOrAddRootObjectInlineCacheId(propertyId, true, false);
        byteCodeGenerator->Writer()->PatchableRootProperty(opcode, location, cacheId, true, false, registerCacheIdForCall);
    }
}